

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

longlong ImGui::RoundScalarWithFormatT<long_long>(char *format,ImGuiDataType data_type,longlong v)

{
  char *__nptr;
  long in_RDX;
  char *in_RDI;
  double dVar1;
  char *p;
  char v_str [64];
  char fmt_sanitized [32];
  char *fmt_start;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char local_48 [32];
  char *local_28;
  long local_20;
  long local_8;
  
  local_20 = in_RDX;
  local_28 = ImParseFormatFindStart(in_RDI);
  if ((*local_28 == '%') && (local_28[1] != '%')) {
    ImParseFormatSanitizeForPrinting
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_28 = local_48;
    ImFormatString(&stack0xffffffffffffff78,0x40,local_28,local_20);
    for (__nptr = &stack0xffffffffffffff78; *__nptr == ' '; __nptr = __nptr + 1) {
    }
    dVar1 = atof(__nptr);
    local_8 = (long)dVar1;
  }
  else {
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}